

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel.cpp
# Opt level: O0

Mat * ncnn::Mat::from_pixels(uchar *pixels,int type,int w,int h,int stride,Allocator *allocator)

{
  uint in_EDX;
  Mat *in_RDI;
  Mat *m;
  uchar *in_stack_00000058;
  Allocator *in_stack_000000a8;
  Mat *in_stack_000000b0;
  int in_stack_000000bc;
  int in_stack_000000c0;
  int in_stack_000000c4;
  Allocator *in_stack_000000c8;
  Mat *in_stack_000000d0;
  int in_stack_000000dc;
  int in_stack_000000e0;
  int in_stack_000000e4;
  uchar *in_stack_000000e8;
  Allocator *in_stack_000000f8;
  Mat *in_stack_00000100;
  int in_stack_0000010c;
  int in_stack_00000110;
  int in_stack_00000114;
  uchar *in_stack_00000118;
  Mat *m_00;
  int in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 uVar1;
  
  uVar1 = 0;
  m_00 = in_RDI;
  Mat(in_RDI);
  if ((in_EDX & 0xffff0000) == 0) {
    if ((in_EDX == 1) || (in_EDX == 2)) {
      from_rgb((uchar *)in_stack_000000c8,in_stack_000000c4,in_stack_000000c0,in_stack_000000bc,
               in_stack_000000b0,in_stack_000000a8);
    }
    if (in_EDX == 3) {
      from_gray((uchar *)CONCAT17(uVar1,in_stack_ffffffffffffffd8),in_stack_ffffffffffffffd4,
                in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,m_00,(Allocator *)in_RDI);
    }
    if ((in_EDX != 4) && (in_EDX != 5)) {
      return m_00;
    }
    from_rgba(in_stack_00000118,in_stack_00000114,in_stack_00000110,in_stack_0000010c,
              in_stack_00000100,in_stack_000000f8);
    return m_00;
  }
  if (in_EDX == 0x10002) {
LAB_00123149:
    from_rgb2bgr(in_stack_000000e8,in_stack_000000e4,in_stack_000000e0,in_stack_000000dc,
                 in_stack_000000d0,in_stack_000000c8);
    return m_00;
  }
  if (in_EDX == 0x10003) {
LAB_00123229:
    from_gray2rgb((uchar *)in_stack_000000c8,in_stack_000000c4,in_stack_000000c0,in_stack_000000bc,
                  in_stack_000000b0,in_stack_000000a8);
    return m_00;
  }
  if (in_EDX == 0x10004) {
LAB_00123277:
    from_rgba2rgb((uchar *)in_stack_000000c8,in_stack_000000c4,in_stack_000000c0,in_stack_000000bc,
                  in_stack_000000b0,in_stack_000000a8);
    return m_00;
  }
  if (in_EDX != 0x10005) {
    if (in_EDX == 0x20001) goto LAB_00123149;
    if (in_EDX == 0x20003) goto LAB_00123229;
    if (in_EDX != 0x20004) {
      if (in_EDX == 0x20005) goto LAB_00123277;
      if (in_EDX == 0x30001) {
        from_rgb2gray((uchar *)CONCAT17(uVar1,in_stack_ffffffffffffffd8),in_stack_ffffffffffffffd4,
                      in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,m_00,(Allocator *)in_RDI);
        return m_00;
      }
      if (in_EDX == 0x30002) {
        from_bgr2gray((uchar *)CONCAT17(uVar1,in_stack_ffffffffffffffd8),in_stack_ffffffffffffffd4,
                      in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,m_00,(Allocator *)in_RDI);
        return m_00;
      }
      if (in_EDX == 0x30004) {
        from_rgba2gray((uchar *)CONCAT17(uVar1,in_stack_ffffffffffffffd8),in_stack_ffffffffffffffd4,
                       in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,m_00,(Allocator *)in_RDI)
        ;
        return m_00;
      }
      if (in_EDX == 0x30005) {
        from_bgra2gray((uchar *)CONCAT17(uVar1,in_stack_ffffffffffffffd8),in_stack_ffffffffffffffd4,
                       in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,m_00,(Allocator *)in_RDI)
        ;
        return m_00;
      }
      if (in_EDX == 0x40001) {
LAB_001231b4:
        from_rgb2rgba(in_stack_00000058,m._4_4_,(int)m,pixels._4_4_,(Mat *)CONCAT44(type,w),
                      (Allocator *)CONCAT44(h,stride));
        return m_00;
      }
      if (in_EDX != 0x40002) {
        if (in_EDX == 0x40003) {
LAB_00123250:
          from_gray2rgba(in_stack_00000058,m._4_4_,(int)m,pixels._4_4_,(Mat *)CONCAT44(type,w),
                         (Allocator *)CONCAT44(h,stride));
          return m_00;
        }
        if (in_EDX != 0x40005) {
          if (in_EDX == 0x50001) goto LAB_00123202;
          if (in_EDX == 0x50002) goto LAB_001231b4;
          if (in_EDX == 0x50003) goto LAB_00123250;
          if (in_EDX != 0x50004) {
            return m_00;
          }
        }
        from_rgba2bgra(in_stack_00000118,in_stack_00000114,in_stack_00000110,in_stack_0000010c,
                       in_stack_00000100,in_stack_000000f8);
        return m_00;
      }
LAB_00123202:
      from_bgr2rgba(in_stack_00000058,m._4_4_,(int)m,pixels._4_4_,(Mat *)CONCAT44(type,w),
                    (Allocator *)CONCAT44(h,stride));
      return m_00;
    }
  }
  from_rgba2bgr((uchar *)in_stack_000000c8,in_stack_000000c4,in_stack_000000c0,in_stack_000000bc,
                in_stack_000000b0,in_stack_000000a8);
  return m_00;
}

Assistant:

Mat Mat::from_pixels(const unsigned char* pixels, int type, int w, int h, int stride, Allocator* allocator)
{
    Mat m;

    if (type & PIXEL_CONVERT_MASK)
    {
        switch (type)
        {
        case PIXEL_RGB2BGR:
        case PIXEL_BGR2RGB:
            from_rgb2bgr(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_RGB2GRAY:
            from_rgb2gray(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_RGB2RGBA:
        case PIXEL_BGR2BGRA:
            from_rgb2rgba(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_BGR2GRAY:
            from_bgr2gray(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_BGR2RGBA:
        case PIXEL_RGB2BGRA:
            from_bgr2rgba(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_GRAY2RGB:
        case PIXEL_GRAY2BGR:
            from_gray2rgb(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_GRAY2RGBA:
        case PIXEL_GRAY2BGRA:
            from_gray2rgba(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_RGBA2RGB:
        case PIXEL_BGRA2BGR:
            from_rgba2rgb(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_RGBA2BGR:
        case PIXEL_BGRA2RGB:
            from_rgba2bgr(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_RGBA2GRAY:
            from_rgba2gray(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_RGBA2BGRA:
        case PIXEL_BGRA2RGBA:
            from_rgba2bgra(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_BGRA2GRAY:
            from_bgra2gray(pixels, w, h, stride, m, allocator);
            break;
        default:
            // unimplemented convert type
            break;
        }
    }
    else
    {
        if (type == PIXEL_RGB || type == PIXEL_BGR)
            from_rgb(pixels, w, h, stride, m, allocator);

        if (type == PIXEL_GRAY)
            from_gray(pixels, w, h, stride, m, allocator);

        if (type == PIXEL_RGBA || type == PIXEL_BGRA)
            from_rgba(pixels, w, h, stride, m, allocator);
    }

    return m;
}